

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParsePackage
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  bool bVar1;
  string *psVar2;
  LocationRecorder location;
  string identifier;
  
  if ((file->_has_bits_[0] & 2) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&identifier,"Multiple package definitions.",(allocator<char> *)&location);
    AddError(this,&identifier);
    std::__cxx11::string::~string((string *)&identifier);
    FileDescriptorProto::clear_package(file);
  }
  bVar1 = Consume(this,"package");
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,root_location,2);
    LocationRecorder::RecordLegacyLocation(&location,&file->super_Message,NAME);
    while( true ) {
      identifier._M_string_length = 0;
      identifier.field_2._M_local_buf[0] = '\0';
      identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
      bVar1 = ConsumeIdentifier(this,&identifier,"Expected identifier.");
      if (!bVar1) break;
      psVar2 = FileDescriptorProto::mutable_package_abi_cxx11_(file);
      std::__cxx11::string::append((string *)psVar2);
      bVar1 = TryConsume(this,".");
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&identifier);
        LocationRecorder::EndAt(&location,&this->input_->previous_);
        bVar1 = ConsumeEndOfDeclaration(this,";",&location);
        goto LAB_001d0748;
      }
      psVar2 = FileDescriptorProto::mutable_package_abi_cxx11_(file);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::~string((string *)&identifier);
    }
    std::__cxx11::string::~string((string *)&identifier);
    bVar1 = false;
LAB_001d0748:
    LocationRecorder::~LocationRecorder(&location);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParsePackage(FileDescriptorProto* file,
                          const LocationRecorder& root_location) {
  if (file->has_package()) {
    AddError("Multiple package definitions.");
    // Don't append the new package to the old one.  Just replace it.  Not
    // that it really matters since this is an error anyway.
    file->clear_package();
  }

  DO(Consume("package"));

  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kPackageFieldNumber);
    location.RecordLegacyLocation(file, DescriptorPool::ErrorCollector::NAME);

    while (true) {
      string identifier;
      DO(ConsumeIdentifier(&identifier, "Expected identifier."));
      file->mutable_package()->append(identifier);
      if (!TryConsume(".")) break;
      file->mutable_package()->append(".");
    }

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}